

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckExpectationTypes
          (ScriptValidator *this,Location *loc,TypeVector *result_types,Expectation *expect,
          char *desc)

{
  initializer_list<wabt::Const> __l;
  bool bVar1;
  ExpectationType EVar2;
  EitherExpectation *pEVar3;
  ConstVector *this_00;
  reference __src;
  allocator<wabt::Const> local_119;
  Const local_118;
  iterator local_c8;
  size_type local_c0;
  vector<wabt::Const,_std::allocator<wabt::Const>_> local_b8;
  undefined1 local_a0 [8];
  Const alt;
  const_iterator __end3;
  const_iterator __begin3;
  ConstVector *__range3;
  EitherExpectation *either;
  char *desc_local;
  Expectation *expect_local;
  TypeVector *result_types_local;
  Location *loc_local;
  ScriptValidator *this_local;
  
  EVar2 = Expectation::type(expect);
  if (EVar2 == Values) {
    CheckExpectation(this,loc,result_types,&expect->expected,desc);
  }
  else if (EVar2 == Either) {
    pEVar3 = cast<wabt::EitherExpectation,wabt::Expectation>(expect);
    this_00 = &(pEVar3->super_ExpectationMixin<(wabt::ExpectationType)1>).super_Expectation.expected
    ;
    __end3 = std::vector<wabt::Const,_std::allocator<wabt::Const>_>::begin(this_00);
    alt.nan_._8_8_ = std::vector<wabt::Const,_std::allocator<wabt::Const>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_wabt::Const_*,_std::vector<wabt::Const,_std::allocator<wabt::Const>_>_>
                                       *)(alt.nan_ + 2)), bVar1) {
      __src = __gnu_cxx::
              __normal_iterator<const_wabt::Const_*,_std::vector<wabt::Const,_std::allocator<wabt::Const>_>_>
              ::operator*(&__end3);
      memcpy(local_a0,__src,0x50);
      memcpy(&local_118,local_a0,0x50);
      local_c8 = &local_118;
      local_c0 = 1;
      std::allocator<wabt::Const>::allocator(&local_119);
      __l._M_len = local_c0;
      __l._M_array = local_c8;
      std::vector<wabt::Const,_std::allocator<wabt::Const>_>::vector(&local_b8,__l,&local_119);
      CheckExpectation(this,loc,result_types,&local_b8,desc);
      std::vector<wabt::Const,_std::allocator<wabt::Const>_>::~vector(&local_b8);
      std::allocator<wabt::Const>::~allocator(&local_119);
      __gnu_cxx::
      __normal_iterator<const_wabt::Const_*,_std::vector<wabt::Const,_std::allocator<wabt::Const>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void ScriptValidator::CheckExpectationTypes(const Location* loc,
                                            const TypeVector& result_types,
                                            const Expectation* expect,
                                            const char* desc) {
  switch (expect->type()) {
    case ExpectationType::Values: {
      CheckExpectation(loc, result_types, expect->expected, desc);
      break;
    }

    case ExpectationType::Either: {
      auto* either = cast<EitherExpectation>(expect);
      for (auto alt : either->expected) {
        CheckExpectation(loc, result_types, {alt}, desc);
      }
      break;
    }
  }
}